

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImTextCountUtf8BytesFromStr(ImWchar *in_text,ImWchar *in_text_end)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  ImWchar *pIVar4;
  bool bVar5;
  
  iVar3 = 0;
  if (in_text_end == (ImWchar *)0x0 || in_text < in_text_end) {
    pIVar4 = in_text + 1;
    iVar3 = 0;
    do {
      uVar1 = pIVar4[-1];
      if (uVar1 == 0) {
        return iVar3;
      }
      if (uVar1 < 0x80) {
        iVar3 = iVar3 + 1;
      }
      else {
        iVar2 = 2;
        if (0x7ff < uVar1) {
          iVar2 = 0;
          if ((uVar1 & 0xfc00) != 0xdc00) {
            iVar2 = ((uVar1 & 0xfc00) == 0xd800) + 3;
          }
        }
        iVar3 = iVar2 + iVar3;
      }
      bVar5 = pIVar4 < in_text_end;
      pIVar4 = pIVar4 + 1;
    } while (bVar5 || in_text_end == (ImWchar *)0x0);
  }
  return iVar3;
}

Assistant:

int ImTextCountUtf8BytesFromStr(const ImWchar* in_text, const ImWchar* in_text_end)
{
    int bytes_count = 0;
    while ((!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            bytes_count++;
        else
            bytes_count += ImTextCountUtf8BytesFromChar(c);
    }
    return bytes_count;
}